

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O3

bool __thiscall
psy::C::Parser::parseSpecifierQualifierList
          (Parser *this,DeclarationSyntax **decl,SpecifierListSyntax **specList)

{
  bool bVar1;
  bool bVar2;
  SyntaxToken *pSVar3;
  SyntaxNodePlainList<psy::C::SpecifierSyntax_*> *pSVar4;
  SyntaxKind SVar5;
  SyntaxKind specK;
  offset_in_Parser_to_subr in_R9;
  SyntaxNodePlainList<psy::C::SpecifierSyntax_*> **specList_00;
  SpecifierSyntax *spec;
  SpecifierSyntax *local_38;
  
  bVar2 = false;
  specList_00 = specList;
  do {
    local_38 = (SpecifierSyntax *)0x0;
    pSVar3 = peek(this,1);
    SVar5 = pSVar3->syntaxK_;
    if (Keyword_sizeof < SVar5) {
      if (SVar5 < Keyword_Ext_char16_t) {
        if (2 < SVar5 - 0x66) {
          if (SVar5 == KeywordAlias___alignas) {
            bVar1 = parseAlignmentSpecifier_AtFirst(this,&local_38);
            goto LAB_002b61a9;
          }
          if (SVar5 != Keyword__Atomic) goto switchD_002b5fea_caseD_23;
          pSVar3 = peek(this,2);
          if (pSVar3->syntaxK_ == OpenParenToken) {
            bVar1 = parseAtomicTypeSpecifier_AtFirst(this,&local_38);
            goto LAB_002b617c;
          }
          SVar5 = AtomicQualifier;
          goto LAB_002b61ba;
        }
switchD_002b5fea_caseD_21:
        parseTrivialSpecifier_AtFirst<psy::C::BasicTypeSpecifierSyntax>
                  (this,&local_38,BasicTypeSpecifier);
        goto LAB_002b608d;
      }
      if (Keyword_ExtGNU___thread < SVar5) {
        if (SVar5 == KeywordAlias___typeof) {
          bVar1 = parseExtGNU_Typeof_AtFirst(this,&local_38);
          goto LAB_002b61a9;
        }
        if (SVar5 != Keyword_ExtGNU___complex__) goto switchD_002b5fea_caseD_23;
        goto switchD_002b5fea_caseD_21;
      }
      if (SVar5 - 0x71 < 2) goto switchD_002b5fea_caseD_21;
      if (SVar5 != KeywordAlias___attribute) goto switchD_002b5fea_caseD_23;
      bVar1 = parseExtGNU_AttributeSpecifier_AtFirst(this,&local_38);
      goto LAB_002b61a9;
    }
    switch(SVar5) {
    case Keyword_char:
    case Keyword_double:
    case Keyword_float:
    case Keyword_int:
    case Keyword_long:
    case Keyword_short:
    case KeywordAlias___signed:
    case Keyword_unsigned:
      goto switchD_002b5fea_caseD_21;
    case KeywordAlias___const:
      SVar5 = ConstQualifier;
      break;
    case Keyword_continue:
    case Keyword_default:
    case Keyword_do:
    case Keyword_else:
    case Keyword_extern:
    case Keyword_for:
    case Keyword_goto:
    case Keyword_if:
    case KeywordAlias___inline:
    case Keyword_register:
    case Keyword_return:
    case Keyword_static:
    case Keyword_switch:
    case Keyword_typedef:
switchD_002b5fea_caseD_23:
      if (specList_00 == specList) {
        DiagnosticsReporter::ExpectedFIRSTofSpecifierQualifier(&this->diagReporter_);
        return false;
      }
      return true;
    case Keyword_enum:
      bVar1 = parseTagTypeSpecifier_AtFirst<psy::C::EnumDeclarationSyntax>
                        (this,decl,&local_38,EnumDeclaration,EnumTypeSpecifier,in_R9);
      goto LAB_002b617c;
    case KeywordAlias___restrict:
      SVar5 = RestrictQualifier;
      break;
    case Keyword_struct:
      SVar5 = StructDeclaration;
      specK = StructTypeSpecifier;
      goto LAB_002b6177;
    case Keyword_union:
      SVar5 = UnionDeclaration;
      specK = UnionTypeSpecifier;
LAB_002b6177:
      bVar1 = parseTagTypeSpecifier_AtFirst<psy::C::StructOrUnionDeclarationSyntax>
                        (this,decl,&local_38,SVar5,specK,in_R9);
LAB_002b617c:
      bVar2 = true;
LAB_002b61a9:
      if (bVar1 == false) {
        return false;
      }
      goto LAB_002b61bf;
    case Keyword_void:
      parseTrivialSpecifier_AtFirst<psy::C::VoidTypeSpecifierSyntax>(this,&local_38);
      goto LAB_002b608d;
    case ENDof_KeywordOrPunctuatorToken:
      SVar5 = VolatileQualifier;
      break;
    default:
      if (SVar5 != IdentifierToken) goto switchD_002b5fea_caseD_23;
      if (bVar2) {
        return true;
      }
      parseTypedefName_AtFirst(this,&local_38);
LAB_002b608d:
      bVar2 = true;
      goto LAB_002b61bf;
    }
LAB_002b61ba:
    parseTrivialSpecifier_AtFirst<psy::C::TypeQualifierSyntax>(this,&local_38,SVar5);
LAB_002b61bf:
    pSVar4 = makeNode<psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax*>,psy::C::SpecifierSyntax*&>
                       (this,&local_38);
    *specList_00 = pSVar4;
    specList_00 = &(pSVar4->
                   super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                   ).
                   super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                   .next;
    if (*decl != (DeclarationSyntax *)0x0) {
      bVar2 = parseTypeQualifiersAndAttributes(this,specList_00);
      return bVar2;
    }
  } while( true );
}

Assistant:

bool Parser::parseSpecifierQualifierList(DeclarationSyntax*& decl,
                                         SpecifierListSyntax*& specList)
{
    DBG_THIS_RULE();

    SpecifierListSyntax** specList_cur = &specList;
    bool seenType = false;
    while (true) {
        SpecifierSyntax* spec = nullptr;
        switch (peek().kind()) {
            // declaration-specifiers -> type-qualifier
            case SyntaxKind::Keyword_const:
                parseTrivialSpecifier_AtFirst<TypeQualifierSyntax>(
                            spec,
                            SyntaxKind::ConstQualifier);
                break;

            case SyntaxKind::Keyword_volatile:
                parseTrivialSpecifier_AtFirst<TypeQualifierSyntax>(
                            spec,
                            SyntaxKind::VolatileQualifier);
                break;

            case SyntaxKind::Keyword_restrict:
                parseTrivialSpecifier_AtFirst<TypeQualifierSyntax>(
                            spec,
                            SyntaxKind::RestrictQualifier);
                break;

            // declaration-specifiers -> type-qualifier -> `_Atomic'
            // declaration-specifiers -> type-specifier -> `_Atomic' `('
            case SyntaxKind::Keyword__Atomic:
                if (peek(2).kind() == SyntaxKind::OpenParenToken) {
                    if (!parseAtomicTypeSpecifier_AtFirst(spec))
                        return false;
                    seenType = true;
                }
                else
                    parseTrivialSpecifier_AtFirst<TypeQualifierSyntax>(
                                spec,
                                SyntaxKind::AtomicQualifier);
                break;

            // declaration-specifiers -> type-specifier -> void
            case SyntaxKind::Keyword_void:
                seenType = true;
                parseTrivialSpecifier_AtFirst<VoidTypeSpecifierSyntax>(spec);
                break;

            // declaration-specifiers -> type-specifier -> basic types
            case SyntaxKind::Keyword_char:
            case SyntaxKind::Keyword_short:
            case SyntaxKind::Keyword_int:
            case SyntaxKind::Keyword_long:
            case SyntaxKind::Keyword_float:
            case SyntaxKind::Keyword_double:
            case SyntaxKind::Keyword__Bool:
            case SyntaxKind::Keyword__Complex:
            case SyntaxKind::Keyword_signed:
            case SyntaxKind::Keyword_unsigned:
            case SyntaxKind::Keyword_Ext_char16_t:
            case SyntaxKind::Keyword_Ext_char32_t:
            case SyntaxKind::Keyword_Ext_wchar_t:
            case SyntaxKind::Keyword_ExtGNU___complex__:
                seenType = true;
                parseTrivialSpecifier_AtFirst<BasicTypeSpecifierSyntax>(
                            spec,
                            SyntaxKind::BasicTypeSpecifier);
                break;

            // declaration-specifiers -> type-specifier ->* `struct'
            case SyntaxKind::Keyword_struct:
                seenType = true;
                if (!parseTagTypeSpecifier_AtFirst<StructOrUnionDeclarationSyntax>(
                            decl,
                            spec,
                            SyntaxKind::StructDeclaration,
                            SyntaxKind::StructTypeSpecifier,
                            &Parser::parseStructDeclaration))
                    return false;
                break;

            // declaration-specifiers -> type-specifier ->* `union'
            case SyntaxKind::Keyword_union:
                seenType = true;
                if (!parseTagTypeSpecifier_AtFirst<StructOrUnionDeclarationSyntax>(
                            decl,
                            spec,
                            SyntaxKind::UnionDeclaration,
                            SyntaxKind::UnionTypeSpecifier,
                            &Parser::parseStructDeclaration))
                    return false;
                break;

            // declaration-specifiers -> type-specifier -> enum-specifier
            case SyntaxKind::Keyword_enum:
                seenType = true;
                if (!parseTagTypeSpecifier_AtFirst<EnumDeclarationSyntax>(
                            decl,
                            spec,
                            SyntaxKind::EnumDeclaration,
                            SyntaxKind::EnumTypeSpecifier,
                            &Parser::parseEnumerator))
                    return false;
                break;

            // declaration-specifiers -> type-specifier -> typedef-name
            case SyntaxKind::IdentifierToken: {
                if (seenType)
                    return true;
                seenType = true;
                parseTypedefName_AtFirst(spec);
                break;
            }

            // declaration-specifiers -> alignment-specifier
            case SyntaxKind::Keyword__Alignas:
                if (!parseAlignmentSpecifier_AtFirst(spec))
                    return false;
                break;

            // declaration-specifiers -> GNU-attribute-specifier
            case SyntaxKind::Keyword_ExtGNU___attribute__:
                if (!parseExtGNU_AttributeSpecifier_AtFirst(spec))
                    return false;
                break;

            // declaration-specifiers -> GNU-typeof-specifier
            case SyntaxKind::Keyword_ExtGNU___typeof__:
                if (!parseExtGNU_Typeof_AtFirst(spec))
                    return false;
                break;

            default:
                if (specList_cur == &specList) {
                    diagReporter_.ExpectedFIRSTofSpecifierQualifier();
                    return false;
                }
                return true;
        }

        *specList_cur = makeNode<SpecifierListSyntax>(spec);
        specList_cur = &(*specList_cur)->next;

        if (decl)
            return parseTypeQualifiersAndAttributes(*specList_cur);
    }
}